

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O1

void dxil_spv::emit_instrumentation_hash
               (SPIRVModule *module,InstructionInstrumentationState *instrumentation,Function *func,
               Id value_id,Id instruction_id)

{
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  iterator iVar2;
  ulong uVar3;
  Block *pBVar4;
  Function *pFVar5;
  Block *elseBlock;
  Id IVar6;
  Builder *this;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  uint uVar12;
  Id IVar13;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b0;
  Instruction *local_a8;
  InstructionInstrumentationState *local_a0;
  uint local_94;
  Instruction *local_90;
  Instruction *local_88;
  Instruction *local_80;
  Instruction *local_78;
  Block *local_70;
  Function *local_68;
  Block *local_60;
  Id local_54;
  Instruction *local_50;
  Instruction *local_48;
  ulong local_40;
  ulong local_38;
  
  local_a8 = (Instruction *)CONCAT44(local_a8._4_4_,instruction_id);
  local_a0 = instrumentation;
  local_94 = value_id;
  this = SPIRVModule::get_builder(module);
  local_70 = (Block *)allocate_in_thread(0x78);
  IVar13 = this->uniqueId + 1;
  this->uniqueId = IVar13;
  local_70->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
  pVVar1 = &local_70->instructions;
  (local_70->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_70->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_70->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_70->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70->parent = func;
  local_70->unreachable = false;
  local_68 = func;
  local_b0._M_head_impl = (Instruction *)allocate_in_thread(0x38);
  (local_b0._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  (local_b0._M_head_impl)->resultId = IVar13;
  (local_b0._M_head_impl)->typeId = 0;
  (local_b0._M_head_impl)->opCode = OpLabel;
  ((local_b0._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_b0._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_b0._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_b0._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)pVVar1,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b0);
  if (local_b0._M_head_impl != (Instruction *)0x0) {
    (*(local_b0._M_head_impl)->_vptr_Instruction[1])();
  }
  pFVar5 = local_68;
  ((local_70->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_70;
  spv::Module::mapInstruction
            (local_68->parent,
             (local_70->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  local_60 = (Block *)allocate_in_thread(0x78);
  IVar13 = this->uniqueId + 1;
  this->uniqueId = IVar13;
  local_60->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
  pVVar1 = &local_60->instructions;
  (local_60->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_60->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_60->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_60->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_60->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_60->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_60->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_60->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_60->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_60->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_60->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_60->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60->parent = pFVar5;
  local_60->unreachable = false;
  local_b0._M_head_impl = (Instruction *)allocate_in_thread(0x38);
  (local_b0._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  (local_b0._M_head_impl)->resultId = IVar13;
  (local_b0._M_head_impl)->typeId = 0;
  (local_b0._M_head_impl)->opCode = OpLabel;
  ((local_b0._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_b0._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_b0._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_b0._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)pVVar1,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b0);
  if (local_b0._M_head_impl != (Instruction *)0x0) {
    (*(local_b0._M_head_impl)->_vptr_Instruction[1])();
  }
  ((local_60->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_60;
  spv::Module::mapInstruction
            (local_68->parent,
             (local_60->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar6 = spv::Builder::makeBoolType(this);
  local_88 = (Instruction *)CONCAT44(local_88._4_4_,IVar6);
  pIVar7 = spv::Builder::addInstruction(this,IVar13,OpIMul);
  pIVar8 = spv::Builder::addInstruction(this,IVar13,OpBitwiseXor);
  local_b0._M_head_impl._0_4_ = (uint)local_a8;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_a8;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar6,0x61,false);
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar7->resultId;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = (local_a0->info).shader_hash;
  local_38 = local_40 >> 0x20;
  uVar12 = (uint)local_40;
  uVar3 = local_40 >> 0x20;
  IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar6,(uint)uVar3 ^ uVar12,false)
  ;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_50 = pIVar8;
  if (local_94 == 0) {
    pIVar7 = spv::Builder::addInstruction(this,IVar13,OpArrayLength);
    local_b0._M_head_impl._0_4_ = local_a0->global_nan_inf_control_var_id;
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_b0._M_head_impl._0_4_ = 0;
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = 0;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    pIVar9 = spv::Builder::addInstruction(this,IVar13,OpISub);
    local_b0._M_head_impl._0_4_ = pIVar7->resultId;
    iVar2._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
    local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar6,2,false);
    iVar2._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    IVar6 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar13);
    pIVar7 = spv::Builder::addInstruction(this,IVar6,OpAccessChain);
    local_b0._M_head_impl._0_4_ = local_a0->global_nan_inf_control_var_id;
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
    local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar6,0,false);
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_b0._M_head_impl._0_4_ = pIVar9->resultId;
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    pIVar9 = spv::Builder::addInstruction(this,IVar13,OpLoad);
    local_b0._M_head_impl._0_4_ = pIVar7->resultId;
    iVar2._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    uVar12 = pIVar9->resultId;
    pIVar7 = spv::Builder::addInstruction(this,IVar13,OpIMul);
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_94 = uVar12;
    local_b0._M_head_impl._0_4_ = uVar12;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = uVar12;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
    local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar6,0xc881,false);
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_50 = spv::Builder::addInstruction(this,IVar13,OpBitwiseXor);
    local_b0._M_head_impl._0_4_ = pIVar8->resultId;
    iVar2._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (local_50->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_50->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (local_50->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_b0._M_head_impl._0_4_ = pIVar7->resultId;
    iVar2._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (local_50->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_50->operands,iVar2,(uint *)&local_b0);
    }
    else {
      *iVar2._M_current = (uint)local_b0._M_head_impl;
      (local_50->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  pIVar7 = spv::Builder::addInstruction(this,IVar13,OpArrayLength);
  pIVar8 = spv::Builder::addInstruction(this,IVar13,OpISub);
  pIVar9 = spv::Builder::addInstruction(this,IVar13,OpBitwiseAnd);
  local_78 = spv::Builder::addInstruction(this,IVar13,OpShiftRightLogical);
  local_48 = spv::Builder::addInstruction(this,IVar13,OpBitwiseAnd);
  local_80 = spv::Builder::addInstruction(this,IVar13,OpShiftLeftLogical);
  IVar6 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar13);
  local_90 = spv::Builder::addInstruction(this,IVar6,OpAccessChain);
  pIVar10 = spv::Builder::addInstruction(this,IVar13,OpAtomicOr);
  local_54 = IVar13;
  local_a8 = spv::Builder::addInstruction(this,IVar13,OpBitwiseAnd);
  local_88 = spv::Builder::addInstruction(this,(Id)local_88,OpIEqual);
  pIVar11 = spv::Builder::addInstruction(this,OpStore);
  local_b0._M_head_impl._0_4_ = local_a0->global_nan_inf_data_var_id;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = 0;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = 0;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar7->resultId;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  pIVar7 = local_78;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_50->resultId;
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar8->resultId;
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pIVar8 = local_80;
  local_b0._M_head_impl._0_4_ = pIVar9->resultId;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_80 = (Instruction *)CONCAT44(local_80._4_4_,(uint)local_b0._M_head_impl);
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,4,false);
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pIVar7 = local_48;
  local_b0._M_head_impl._0_4_ = pIVar9->resultId;
  iVar2._M_current =
       (local_48->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (local_48->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_48->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (local_48->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pIVar9 = local_90;
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0xf,false);
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar7->resultId;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_a0->global_nan_inf_control_var_id;
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_78->resultId;
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar9->resultId;
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar8->resultId;
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar10->resultId;
  iVar2._M_current =
       (local_a8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (local_a8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_a8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (local_a8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pIVar7 = local_88;
  local_b0._M_head_impl._0_4_ = pIVar8->resultId;
  iVar2._M_current =
       (local_a8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (local_a8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_a8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (local_a8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_a8->resultId;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_a0->should_report_instrumentation_id;
  iVar2._M_current =
       (pIVar11->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar11->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar11->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar11->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = spv::Builder::makeBoolConstant(this,false,false);
  iVar2._M_current =
       (pIVar11->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar11->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar11->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar11->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  elseBlock = local_60;
  IVar13 = pIVar7->resultId;
  uVar12 = pIVar8->resultId;
  local_78 = (Instruction *)CONCAT44(local_78._4_4_,pIVar9->resultId);
  spv::Builder::createSelectionMerge(this,local_60,0);
  pBVar4 = local_70;
  spv::Builder::createConditionalBranch(this,IVar13,local_70,elseBlock);
  IVar13 = local_54;
  this->buildPoint = pBVar4;
  IVar6 = spv::Builder::makeVectorType(this,local_54,4);
  pIVar7 = spv::Builder::addInstruction(this,IVar6,OpCompositeConstruct);
  local_a8 = spv::Builder::addInstruction(this,IVar13,OpShiftLeftLogical);
  IVar6 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar6);
  pIVar8 = spv::Builder::addInstruction(this,IVar6,OpAccessChain);
  pIVar9 = spv::Builder::addInstruction(this,OpStore);
  local_90 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  pIVar10 = spv::Builder::addInstruction(this,IVar13,OpAtomicOr);
  local_70 = (Block *)spv::Builder::addInstruction(this,OpMemoryBarrier);
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,(uint)local_40,false);
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,(uint)local_38,false);
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ =
       (local_68->parameterInstructions).
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_start[1]->resultId;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_94;
  iVar2._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = local_94;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pIVar11 = local_a8;
  iVar2._M_current =
       (local_a8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b0._M_head_impl._0_4_ = uVar12;
  if (iVar2._M_current ==
      (local_a8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_a8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = uVar12;
    (local_a8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0x10,false);
  iVar2._M_current =
       (pIVar11->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar11->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar11->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar11->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_a0->global_nan_inf_data_var_id;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = (uint)local_80;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_80;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = pIVar8->resultId;
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pIVar8 = local_90;
  local_b0._M_head_impl._0_4_ = pIVar7->resultId;
  iVar2._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  pBVar4 = local_70;
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0x48,false);
  iVar2._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar2._M_current =
       (((Vector<Id> *)((long)pBVar4 + 0x18))->
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (((Vector<Id> *)((long)pBVar4 + 0x18))->
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)pBVar4 + 0x18),iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (((Vector<Id> *)((long)pBVar4 + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0x48,false);
  iVar2._M_current =
       (((Vector<Id> *)((long)pBVar4 + 0x18))->
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (((Vector<Id> *)((long)pBVar4 + 0x18))->
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)pBVar4 + 0x18),iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (((Vector<Id> *)((long)pBVar4 + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = (uint)local_78;
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_78;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b0._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = (uint)local_b0._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_b0._M_head_impl._0_4_ = local_a8->resultId;
  iVar2._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar2,(uint *)&local_b0);
  }
  else {
    *iVar2._M_current = local_a8->resultId;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pBVar4 = local_60;
  spv::Builder::createBranch(this,local_60);
  this->buildPoint = pBVar4;
  return;
}

Assistant:

void emit_instrumentation_hash(SPIRVModule &module, const InstructionInstrumentationState &instrumentation,
                               spv::Function *func, spv::Id value_id, spv::Id instruction_id)
{
	auto &builder = module.get_builder();
	auto *write_payload_path = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_payload_path = new spv::Block(builder.getUniqueId(), *func);

	spv::Id u32_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();
	auto *prime_mul = builder.addInstruction(u32_type, spv::OpIMul);
	auto *hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);

	prime_mul->addIdOperand(instruction_id);
	prime_mul->addIdOperand(builder.makeUintConstant(97)); // Arbitrary prime number

	hash->addIdOperand(prime_mul->getResultId());
	auto shader_hash = instrumentation.info.shader_hash;
	hash->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash) ^ uint32_t(shader_hash >> 32)));

	if (!value_id)
	{
		// For AssumeTrue instrumentation, we're more interested in the dispatch ID.
		// We've reserved space for it in the second last u32 of the control buffer.
		auto *len = builder.addInstruction(u32_type, spv::OpArrayLength);
		len->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		len->addImmediateOperand(0);

		auto *len_minus_2 = builder.addInstruction(u32_type, spv::OpISub);
		len_minus_2->addIdOperand(len->getResultId());
		len_minus_2->addIdOperand(builder.makeUintConstant(2));

		auto *cookie_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassStorageBuffer, u32_type), spv::OpAccessChain);
		cookie_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		cookie_chain->addIdOperand(builder.makeUintConstant(0));
		cookie_chain->addIdOperand(len_minus_2->getResultId());

		auto *load = builder.addInstruction(u32_type, spv::OpLoad);
		load->addIdOperand(cookie_chain->getResultId());
		value_id = load->getResultId();

		auto *mul = builder.addInstruction(u32_type, spv::OpIMul);
		mul->addIdOperand(value_id);
		mul->addIdOperand(builder.makeUintConstant(51329u));

		// Allow each dispatch to report their own faults.
		auto *ext_hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);
		ext_hash->addIdOperand(hash->getResultId());
		ext_hash->addIdOperand(mul->getResultId());

		hash = ext_hash;
	}

	auto *payload_size = builder.addInstruction(u32_type, spv::OpArrayLength);
	auto *sub_1 = builder.addInstruction(u32_type, spv::OpISub);
	auto *mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_word = builder.addInstruction(u32_type, spv::OpShiftRightLogical);
	auto *control_bit = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_mask = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
	auto *access_chain = builder.addInstruction(
	    builder.makePointer(spv::StorageClassStorageBuffer, u32_type),
	    spv::OpAccessChain);
	auto *atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
	auto *atomic_result_mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *atomic_need_write = builder.addInstruction(bool_type, spv::OpIEqual);
	auto *store_op = builder.addInstruction(spv::OpStore);

	payload_size->addIdOperand(instrumentation.global_nan_inf_data_var_id);
	payload_size->addImmediateOperand(0);
	sub_1->addIdOperand(payload_size->getResultId());
	sub_1->addIdOperand(builder.makeUintConstant(1));
	mask->addIdOperand(hash->getResultId());
	mask->addIdOperand(sub_1->getResultId());
	spv::Id mask_id = mask->getResultId();

	control_word->addIdOperand(mask->getResultId());
	control_word->addIdOperand(builder.makeUintConstant(4));
	control_bit->addIdOperand(mask->getResultId());
	control_bit->addIdOperand(builder.makeUintConstant(15));
	control_mask->addIdOperand(builder.makeUintConstant(1));
	control_mask->addIdOperand(control_bit->getResultId());

	access_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
	access_chain->addIdOperand(builder.makeUintConstant(0));
	access_chain->addIdOperand(control_word->getResultId());

	atomic_or->addIdOperand(access_chain->getResultId());
	atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_or->addIdOperand(builder.makeUintConstant(0));
	atomic_or->addIdOperand(control_mask->getResultId());

	atomic_result_mask->addIdOperand(atomic_or->getResultId());
	atomic_result_mask->addIdOperand(control_mask->getResultId());
	atomic_need_write->addIdOperand(atomic_result_mask->getResultId());
	atomic_need_write->addIdOperand(builder.makeUintConstant(0));

	store_op->addIdOperand(instrumentation.should_report_instrumentation_id);
	store_op->addIdOperand(builder.makeBoolConstant(false));

	spv::Id cond_id = atomic_need_write->getResultId();
	spv::Id control_mask_id = control_mask->getResultId();
	spv::Id control_chain_id = access_chain->getResultId();

	builder.createSelectionMerge(merge_payload_path, 0);
	builder.createConditionalBranch(cond_id, write_payload_path, merge_payload_path);
	builder.setBuildPoint(write_payload_path);
	{
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);

		auto *composite = builder.addInstruction(uvec4_type, spv::OpCompositeConstruct);
		auto *shift_16 = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
		access_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassStorageBuffer, uvec4_type),
			spv::OpAccessChain);
		store_op = builder.addInstruction(spv::OpStore);
		auto *barrier_op = builder.addInstruction(spv::OpMemoryBarrier);
		atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
		// Important this comes after the atomic or.
		auto *barrier_op2 = builder.addInstruction(spv::OpMemoryBarrier);

		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 0)));
		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 32)));
		composite->addIdOperand(func->getParamId(1));
		composite->addIdOperand(value_id);

		shift_16->addIdOperand(control_mask_id);
		shift_16->addIdOperand(builder.makeUintConstant(16));

		access_chain->addIdOperand(instrumentation.global_nan_inf_data_var_id);
		access_chain->addIdOperand(builder.makeUintConstant(0));
		access_chain->addIdOperand(mask_id);

		store_op->addIdOperand(access_chain->getResultId());
		store_op->addIdOperand(composite->getResultId());

		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                  spv::MemorySemanticsAcquireReleaseMask));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                   spv::MemorySemanticsAcquireReleaseMask));

		atomic_or->addIdOperand(control_chain_id);
		atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_or->addIdOperand(builder.makeUintConstant(0));
		atomic_or->addIdOperand(shift_16->getResultId());

		builder.createBranch(merge_payload_path);
	}
	builder.setBuildPoint(merge_payload_path);
}